

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primality-test-baseline.c
# Opt level: O0

uint64_t gaIAddMod(uint64_t a,uint64_t b,uint64_t m)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t m_local;
  uint64_t b_local;
  uint64_t a_local;
  undefined8 local_8;
  
  uVar1 = a % m;
  uVar2 = b % m;
  if (uVar2 < m - uVar1) {
    local_8 = uVar1 + uVar2;
  }
  else {
    local_8 = (uVar1 + uVar2) - m;
  }
  return local_8;
}

Assistant:

uint64_t gaIAddMod    (uint64_t a, uint64_t b, uint64_t m){
	a %= m;
	b %= m;

	if(m-a > b){
		return a+b;
	}else{
		return a+b-m;
	}
}